

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::Configurations::Parser::parseFromFile
               (string *configurationFile,Configurations *sender,Configurations *base)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  string *in_RDI;
  stringstream internalInfoStream_1;
  string currLevelStr;
  string currConfigStr;
  Level currLevel;
  string line;
  bool parsedSuccessfully;
  string *in_stack_000002a8;
  stringstream internalInfoStream;
  ifstream fileStream_;
  undefined6 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9be;
  undefined1 in_stack_fffffffffffff9bf;
  Configurations *in_stack_fffffffffffff9c0;
  string local_5f0 [32];
  stringstream local_5d0 [16];
  ostream local_5c0 [376];
  string local_448 [32];
  string local_428 [36];
  undefined4 local_404;
  string local_400 [39];
  byte local_3d9;
  string local_3d8 [32];
  stringstream local_3b8 [16];
  ostream local_3a8 [392];
  istream local_220 [536];
  string *local_8;
  
  local_8 = in_RDI;
  setFromBase(in_stack_fffffffffffff9c0,
              (Configurations *)
              CONCAT17(in_stack_fffffffffffff9bf,
                       CONCAT16(in_stack_fffffffffffff9be,in_stack_fffffffffffff9b8)));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar3,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_3b8);
    poVar4 = std::operator<<(local_3a8,"Unable to open configuration file [");
    poVar4 = std::operator<<(poVar4,local_8);
    std::operator<<(poVar4,"] for parsing.");
    poVar4 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x14e);
    poVar4 = std::operator<<(poVar4,") [fileStream_.is_open()");
    poVar4 = std::operator<<(poVar4,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    poVar4 = std::operator<<(poVar4,local_3d8);
    poVar4 = std::operator<<(poVar4,"\"");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3d8);
    std::__cxx11::stringstream::~stringstream(local_3b8);
  }
  local_3d9 = 0;
  std::__cxx11::string::string(local_400);
  local_404 = 0x3f2;
  std::__cxx11::string::string(local_428);
  std::__cxx11::string::string(local_448);
  while (bVar2 = std::ios::good(), bVar1 = local_3d9, (bVar2 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_400);
    local_3d9 = parseLine(in_stack_000002a8,(string *)line.field_2._8_8_,
                          (string *)line.field_2._M_allocated_capacity,
                          (Level *)line._M_string_length,(Configurations *)line._0_8_);
    if (!(bool)local_3d9) {
      std::__cxx11::stringstream::stringstream(local_5d0);
      poVar4 = std::operator<<(local_5c0,"Unable to parse configuration line: ");
      std::operator<<(poVar4,local_400);
      poVar4 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ")
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x157);
      poVar4 = std::operator<<(poVar4,") [parsedSuccessfully");
      poVar4 = std::operator<<(poVar4,"] WITH MESSAGE \"");
      std::__cxx11::stringstream::str();
      poVar4 = std::operator<<(poVar4,local_5f0);
      poVar4 = std::operator<<(poVar4,"\"");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::stringstream::~stringstream(local_5d0);
    }
  }
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string(local_400);
  std::ifstream::~ifstream(local_220);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Configurations::Parser::parseFromFile(const std::string& configurationFile, Configurations* sender,
    Configurations* base) {
  sender->setFromBase(base);
  std::ifstream fileStream_(configurationFile.c_str(), std::ifstream::in);
  ELPP_ASSERT(fileStream_.is_open(), "Unable to open configuration file [" << configurationFile << "] for parsing.");
  bool parsedSuccessfully = false;
  std::string line = std::string();
  Level currLevel = Level::Unknown;
  std::string currConfigStr = std::string();
  std::string currLevelStr = std::string();
  while (fileStream_.good()) {
    std::getline(fileStream_, line);
    parsedSuccessfully = parseLine(&line, &currConfigStr, &currLevelStr, &currLevel, sender);
    ELPP_ASSERT(parsedSuccessfully, "Unable to parse configuration line: " << line);
  }
  return parsedSuccessfully;
}